

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osdtext.cpp
# Opt level: O0

void __thiscall CS248::OSDText::del_line(OSDText *this,int line_id)

{
  bool bVar1;
  pointer pOVar2;
  int in_ESI;
  long in_RDI;
  iterator it;
  vector<CS248::OSDLine,_std::allocator<CS248::OSDLine>_> *in_stack_ffffffffffffffb8;
  __normal_iterator<CS248::OSDLine_*,_std::vector<CS248::OSDLine,_std::allocator<CS248::OSDLine>_>_>
  *in_stack_ffffffffffffffc0;
  vector<CS248::OSDLine,_std::allocator<CS248::OSDLine>_> *in_stack_ffffffffffffffd0;
  const_iterator in_stack_ffffffffffffffd8;
  __normal_iterator<CS248::OSDLine_*,_std::vector<CS248::OSDLine,_std::allocator<CS248::OSDLine>_>_>
  local_18;
  int local_c;
  
  local_c = in_ESI;
  local_18._M_current =
       (OSDLine *)
       std::vector<CS248::OSDLine,_std::allocator<CS248::OSDLine>_>::begin
                 (in_stack_ffffffffffffffb8);
  while( true ) {
    std::vector<CS248::OSDLine,_std::allocator<CS248::OSDLine>_>::end(in_stack_ffffffffffffffb8);
    bVar1 = __gnu_cxx::operator!=
                      (in_stack_ffffffffffffffc0,
                       (__normal_iterator<CS248::OSDLine_*,_std::vector<CS248::OSDLine,_std::allocator<CS248::OSDLine>_>_>
                        *)in_stack_ffffffffffffffb8);
    if (!bVar1) {
      return;
    }
    pOVar2 = __gnu_cxx::
             __normal_iterator<CS248::OSDLine_*,_std::vector<CS248::OSDLine,_std::allocator<CS248::OSDLine>_>_>
             ::operator->(&local_18);
    if (pOVar2->id == local_c) break;
    __gnu_cxx::
    __normal_iterator<CS248::OSDLine_*,_std::vector<CS248::OSDLine,_std::allocator<CS248::OSDLine>_>_>
    ::operator++(&local_18);
  }
  __gnu_cxx::
  __normal_iterator<CS248::OSDLine_const*,std::vector<CS248::OSDLine,std::allocator<CS248::OSDLine>>>
  ::__normal_iterator<CS248::OSDLine*>
            ((__normal_iterator<const_CS248::OSDLine_*,_std::vector<CS248::OSDLine,_std::allocator<CS248::OSDLine>_>_>
              *)(in_RDI + 0x30),
             (__normal_iterator<CS248::OSDLine_*,_std::vector<CS248::OSDLine,_std::allocator<CS248::OSDLine>_>_>
              *)in_stack_ffffffffffffffb8);
  std::vector<CS248::OSDLine,_std::allocator<CS248::OSDLine>_>::erase
            (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffd8);
  return;
}

Assistant:

void OSDText::del_line(int line_id) {
  vector<OSDLine>::iterator it = lines.begin();
  while(it != lines.end()) {
    if(it->id == line_id) {
      lines.erase(it);
      break;
    }
    ++it;
  }
}